

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O1

int __thiscall TreeItem::row(TreeItem *this)

{
  int iVar1;
  TreeItem *pTVar2;
  bool bVar3;
  int iVar4;
  _List_node_base *p_Var5;
  
  pTVar2 = this->parentItem;
  if (pTVar2 != (TreeItem *)0x0) {
    iVar1 = (int)(pTVar2->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
                 _M_impl._M_node._M_size;
    bVar3 = 0 < iVar1;
    if (0 < iVar1) {
      p_Var5 = (pTVar2->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      if ((TreeItem *)p_Var5[1]._M_next == this) {
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        do {
          if (iVar1 + -1 == iVar4) {
            return 0;
          }
          p_Var5 = p_Var5->_M_next;
          iVar4 = iVar4 + 1;
        } while ((TreeItem *)p_Var5[1]._M_next != this);
        bVar3 = iVar4 < iVar1;
      }
      if (bVar3) {
        return iVar4;
      }
    }
  }
  return 0;
}

Assistant:

int TreeItem::row() const
{
    if (parentItem) {
        std::list<TreeItem*>::const_iterator iter = parentItem->childItems.begin();
        for (int i = 0; i < (int)parentItem->childItems.size(); ++i, ++iter) {
            if (const_cast<TreeItem*>(this) == *iter)
                return i;
        }
    }
    return 0;
}